

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Verbosity VVar4;
  int iVar5;
  element_type *peVar6;
  SPxOut *_spxout;
  SPxOut *manip;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Real __x;
  double dVar7;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  int i_3;
  Verbosity old_verbosity_10;
  int nNonzeros_1;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  int i_2;
  Verbosity old_verbosity_7;
  VectorRational primal_1;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int i_1;
  Verbosity old_verbosity_3;
  int nNonzeros;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  Verbosity old_verbosity;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  int printwidth;
  int printprec;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff978;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff980;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff988;
  SPxOut *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  int iVar8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined2 in_stack_fffffffffffff9d4;
  undefined1 in_stack_fffffffffffff9d6;
  undefined1 in_stack_fffffffffffff9d7;
  SPxOut *in_stack_fffffffffffff9d8;
  double in_stack_fffffffffffff9e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9f0;
  Verbosity local_438;
  Verbosity local_434 [3];
  undefined1 local_428 [68];
  Verbosity local_3e4;
  Verbosity local_3e0 [2];
  undefined1 local_3d8 [72];
  int local_390;
  Verbosity local_38c;
  Verbosity local_388;
  int local_384;
  Verbosity local_380;
  Verbosity local_37c;
  undefined1 local_378 [76];
  int local_32c;
  int local_328;
  Verbosity local_324;
  Verbosity local_320 [2];
  undefined1 local_318 [76];
  int local_2cc;
  Verbosity local_2c8;
  Verbosity local_2c4 [8];
  Verbosity local_2a4;
  Verbosity local_2a0;
  int local_29c;
  int local_284;
  Verbosity local_280;
  Verbosity local_27c;
  undefined1 local_278 [56];
  int local_240;
  int local_23c;
  Verbosity local_238;
  Verbosity local_234 [6];
  undefined1 local_21c [56];
  int local_1e4;
  Verbosity local_1e0;
  Verbosity local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1bc;
  Verbosity local_1b8;
  Verbosity local_1b4;
  undefined1 local_1b0 [56];
  int local_178;
  int local_174;
  Verbosity local_170;
  Verbosity local_16c [6];
  undefined1 local_154 [56];
  int local_11c;
  Verbosity local_118;
  Verbosity local_114 [16];
  int local_d4;
  int local_d0;
  byte local_ca;
  byte local_c9;
  long local_b8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  Verbosity *local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  Verbosity *local_60;
  undefined1 *local_58;
  Verbosity *local_50;
  Verbosity *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_c9 = in_CL & 1;
  local_ca = in_R8B & 1;
  local_b8 = in_RDI;
  ::soplex::
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff978);
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x14c32f);
  __x = ::soplex::Tolerances::epsilon(peVar6);
  dVar7 = log10(__x);
  local_d0 = (int)-dVar7;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x14c37f);
  local_d4 = local_d0 + 10;
  if ((local_c9 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x14c3ab);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff990,(int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRay(in_stack_fffffffffffff988,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff980);
    if (bVar1) {
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_114[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_118 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_118);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_114);
      }
      for (local_11c = 0; iVar8 = local_11c,
          iVar5 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x14c4fe), iVar8 < iVar5; local_11c = local_11c + 1) {
        local_40 = ::soplex::
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff980,
                                (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
        local_38 = local_154;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff978);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff978);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14c588);
        ::soplex::Tolerances::epsilon(peVar6);
        bVar1 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x14c5c7)
        ;
        if (((bVar1) && (local_b8 != -8)) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_16c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_170 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_170);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff980,
                     (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          local_174 = (int)std::setw(local_d4);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff978,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          local_178 = (int)std::setprecision(local_d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff978,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          local_30 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff980,
                                  (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
          local_28 = local_1b0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_16c);
        }
      }
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_1b4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_1b8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_1b8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        local_1bc = (int)std::setprecision(1);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff978,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff980,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff978);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff978);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14c900);
        ::soplex::Tolerances::epsilon(peVar6);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(double)in_stack_fffffffffffff978);
        local_1d4 = (int)std::setprecision(8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff978,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff980,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff978);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff980,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x14c9c1)
        ;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_1b4);
      }
    }
    else {
      bVar1 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isPrimalFeasible(in_stack_fffffffffffff980);
      if ((bVar1) &&
         (bVar1 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::getPrimal(in_stack_fffffffffffff988,
                              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffff980), bVar1)) {
        local_1d8 = 0;
        if ((local_b8 != -8) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_1dc = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_1e0 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_1e0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_1dc);
        }
        for (local_1e4 = 0; iVar8 = local_1e4,
            iVar5 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x14cb31), iVar8 < iVar5; local_1e4 = local_1e4 + 1) {
          local_20 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff980,
                                  (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
          local_18 = local_21c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff978);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff978);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x14cbbb);
          ::soplex::Tolerances::epsilon(peVar6);
          bVar1 = ::soplex::
                  isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x14cbfa);
          if (bVar1) {
            if ((local_b8 != -8) &&
               (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
              local_234[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
              local_238 = INFO1;
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_238);
              ::soplex::NameSet::operator[]
                        ((NameSet *)in_stack_fffffffffffff980,
                         (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
              local_23c = (int)std::setw(local_d4);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff978,
                         (_Setw)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
              local_240 = (int)std::setprecision(local_d0);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff978,
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
              local_10 = ::soplex::
                         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)in_stack_fffffffffffff980,
                                      (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
              local_8 = local_278;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff978);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff980,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff978);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff980,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_234);
            }
            local_1d8 = local_1d8 + 1;
          }
        }
        if ((local_b8 != -8) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_27c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_280 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_280);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          local_284 = (int)std::setprecision(1);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff978,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff978);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff978);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x14cf42);
          ::soplex::Tolerances::epsilon(peVar6);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(double)in_stack_fffffffffffff978);
          local_29c = (int)std::setprecision(8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff978,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x14d03f);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_27c);
        }
      }
      else if ((local_b8 != -8) &&
              (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_2a0 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_2a4 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_2a4);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_2a0);
      }
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x14d13b);
  }
  if ((local_ca & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x14d16a);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff990,(int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (in_stack_fffffffffffff988,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff980);
    if (bVar1) {
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_2c4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_2c8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_2c8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_2c4);
      }
      for (local_2cc = 0; iVar8 = local_2cc,
          iVar5 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x14d297), iVar8 < iVar5; local_2cc = local_2cc + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20));
        local_320[1] = 0;
        local_78 = local_318;
        local_80 = local_320 + 1;
        local_88 = 0;
        local_90 = 0;
        local_48 = local_80;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff9d8,
                   (longlong *)
                   CONCAT17(in_stack_fffffffffffff9d7,
                            CONCAT16(in_stack_fffffffffffff9d6,
                                     CONCAT24(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0)))
                   ,(type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff978,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x14d35e);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x14d374);
        if (((bVar1) && (local_b8 != -8)) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_320[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_324 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_324);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff980,
                     (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          local_328 = (int)std::setw(local_d4);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff978,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          local_32c = (int)std::setprecision(local_d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff978,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          local_b0 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff980,
                                  (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
          local_a8 = local_378;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff990,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff988);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff978);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff980,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x14d53c);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_320);
        }
      }
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_37c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_380 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_380);
        in_stack_fffffffffffff9d8 =
             ::soplex::operator<<
                       ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff980,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_37c);
      }
    }
    uVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(in_stack_fffffffffffff980);
    if (((bool)uVar2) &&
       (uVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(in_stack_fffffffffffff988,
                                    (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff980), (bool)uVar3)) {
      local_384 = 0;
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_388 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_38c = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_38c);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_388);
      }
      local_390 = 0;
      while (iVar8 = local_390,
            iVar5 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)0x14d799), iVar8 < iVar5) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20));
        local_3e0[1] = 0;
        local_58 = local_3d8;
        local_60 = local_3e0 + 1;
        local_68 = 0;
        local_70 = 0;
        local_50 = local_60;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff9d8,
                   (longlong *)
                   CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffff9d4,iVar5))),
                   (type *)CONCAT44(iVar8,in_stack_fffffffffffff9c8));
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff978,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x14d851);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x14d864);
        if (bVar1) {
          if ((local_b8 != -8) &&
             (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
            local_3e0[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
            local_3e4 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3e4);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff980,
                       (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
            local_a0 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff980,
                                    (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
            local_98 = local_428;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffff990,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffff988);
            in_stack_fffffffffffff990 =
                 ::soplex::operator<<
                           ((SPxOut *)in_stack_fffffffffffff980,
                            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)in_stack_fffffffffffff978);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff980,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x14d9bb);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_3e0);
          }
          local_384 = local_384 + 1;
        }
        local_390 = local_390 + 1;
      }
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_434[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_434[1] = 3;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_434 + 1);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        _spxout = ::soplex::operator<<
                            ((SPxOut *)in_stack_fffffffffffff980,
                             (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
        manip = ::soplex::operator<<(_spxout,(char *)in_stack_fffffffffffff978);
        ::soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_434 + 2);
      }
    }
    else if ((local_b8 != -8) &&
            (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
      local_434[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
      local_438 = INFO1;
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_438);
      ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_434);
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x14dbf1);
  }
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}